

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockcache.cc
# Opt level: O0

int bcache_read(filemgr *file,bid_t bid,void *buf)

{
  byte bVar1;
  __pointer_type pfVar2;
  hash_elem *phVar3;
  void *in_RDX;
  ulong uVar4;
  ulong in_RSI;
  size_t shard_num;
  timeval tp;
  fnamedic_item *fname;
  bcache_item query;
  bcache_item *item;
  hash_elem *h;
  uint64_t in_stack_ffffffffffffff68;
  atomic<unsigned_long> *in_stack_ffffffffffffff70;
  hash_elem *in_stack_ffffffffffffff78;
  hash *in_stack_ffffffffffffff80;
  
  pfVar2 = std::atomic<fnamedic_item_*>::load
                     ((atomic<fnamedic_item_*> *)in_stack_ffffffffffffff78,
                      (memory_order)((ulong)in_stack_ffffffffffffff70 >> 0x20));
  if (pfVar2 != (__pointer_type)0x0) {
    gettimeofday((timeval *)&stack0xffffffffffffff78,(__timezone_ptr_t)0x0);
    atomic_store_uint64_t(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,memory_order_relaxed);
    uVar4 = in_RSI % pfVar2->num_shards;
    pthread_spin_lock(&pfVar2->shards[uVar4].lock);
    phVar3 = hash_find(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    if (phVar3 != (hash_elem *)0x0) {
      bVar1 = std::__atomic_base::operator_cast_to_unsigned_char
                        ((__atomic_base<unsigned_char> *)in_stack_ffffffffffffff78);
      if ((bVar1 & 4) != 0) {
        pthread_spin_unlock(&pfVar2->shards[uVar4].lock);
        return 0;
      }
      bVar1 = std::__atomic_base::operator_cast_to_unsigned_char
                        ((__atomic_base<unsigned_char> *)in_stack_ffffffffffffff78);
      if ((bVar1 & 1) == 0) {
        list_remove(&pfVar2->shards[uVar4].cleanlist,(list_elem *)(phVar3 + 1));
        list_push_front(&pfVar2->shards[uVar4].cleanlist,(list_elem *)(phVar3 + 1));
      }
      memcpy(in_RDX,phVar3[-1].avl.right,(long)bcache_blocksize);
      _bcache_set_score((bcache_item *)&phVar3[-1].avl.left);
      pthread_spin_unlock(&pfVar2->shards[uVar4].lock);
      return bcache_blocksize;
    }
    pthread_spin_unlock(&pfVar2->shards[uVar4].lock);
  }
  return 0;
}

Assistant:

int bcache_read(struct filemgr *file, bid_t bid, void *buf)
{
    struct hash_elem *h;
    struct bcache_item *item;
    struct bcache_item query;
    struct fnamedic_item *fname;

    // Note that we don't need to grab bcache_lock here as the block cache
    // is already created and binded when the file is created or opened for
    // the first time.
    fname = file->bcache.load(std::memory_order_relaxed);

    if (fname) {
        // file exists
        // set query
        query.bid = bid;
        // Update the access timestamp.
        struct timeval tp;
        gettimeofday(&tp, NULL); // TODO: Need to implement a better way of
                                 // getting the timestamp to avoid the overhead of
                                 // gettimeofday()
        atomic_store_uint64_t(&fname->access_timestamp,
                              (uint64_t) (tp.tv_sec * 1000000 + tp.tv_usec),
                              std::memory_order_relaxed);

        size_t shard_num = bid % fname->num_shards;
        spin_lock(&fname->shards[shard_num].lock);

        // search shard hash table
        h = hash_find(&fname->shards[shard_num].hashtable, &query.hash_elem);
        if (h) {
            // cache hit
            item = _get_entry(h, struct bcache_item, hash_elem);
            if (item->flag & BCACHE_FREE) {
                spin_unlock(&fname->shards[shard_num].lock);
                DBG("Warning: failed to read the buffer cache entry for a file '%s' "
                    "because the entry belongs to the free list!\n",
                    file->filename);
                return 0;
            }

            // move the item to the head of list if the block is clean
            // (don't care if the block is dirty)
            if (!(item->flag & BCACHE_DIRTY)) {
                // TODO: Scanning the list would cause some overhead. We need to devise
                // the better data structure to provide a fast lookup for the clean list.
                list_remove(&fname->shards[shard_num].cleanlist, &item->list_elem);
                list_push_front(&fname->shards[shard_num].cleanlist, &item->list_elem);
            }

            memcpy(buf, item->addr, bcache_blocksize);
            _bcache_set_score(item);

            spin_unlock(&fname->shards[shard_num].lock);

            return bcache_blocksize;
        } else {
            // cache miss
            spin_unlock(&fname->shards[shard_num].lock);
        }
    }

    // does not exist .. cache miss
    return 0;
}